

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

AActor * P_SpawnPuff(AActor *source,PClassActor *pufftype,DVector3 *pos1,DAngle *hitdir,
                    DAngle *particledir,int updown,int flags,AActor *vict)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  SDWORD SVar4;
  AActor *this;
  FState *newstate;
  int iVar5;
  FSoundID *sound_id;
  DVector3 local_70;
  AActor *local_58;
  FSoundID local_4c;
  FSoundID local_48;
  FName local_44;
  FName local_40;
  FName local_3c;
  DAngle local_38;
  
  local_70.X = pos1->X;
  local_70.Y = pos1->Y;
  local_70.Z = pos1->Z;
  local_58 = source;
  if ((flags & 0x10U) == 0) {
    uVar2 = FRandom::GenRand32(&pr_spawnpuff);
    uVar3 = FRandom::GenRand32(&pr_spawnpuff);
    local_70.Z = (double)(int)((uVar2 & 0xff) - (uVar3 & 0xff)) * 0.015625 + local_70.Z;
  }
  this = AActor::StaticSpawn(pufftype,&local_70,ALLOW_REPLACE,false);
  if (this == (AActor *)0x0) {
    return (AActor *)0x0;
  }
  if ((((this->flags4).Value & 0x10) != 0) && (0 < this->tics)) {
    uVar2 = FRandom::GenRand32(&pr_spawnpuff);
    iVar5 = this->tics - (uVar2 & 3);
    SVar4 = 1;
    if (1 < iVar5) {
      SVar4 = iVar5;
    }
    this->tics = SVar4;
  }
  if (vict != (AActor *)0x0) {
    if (((this->flags7).Value & 0x4000) != 0) {
      (this->target).field_0.p = vict;
    }
    if (((this->flags7).Value & 0x8000) != 0) {
      (this->master).field_0.p = vict;
    }
    if (((this->flags7).Value & 0x10000) != 0) {
      (this->tracer).field_0.p = vict;
    }
  }
  if (((this->flags5).Value & 0x800000) != 0) {
    (this->target).field_0.p = local_58;
  }
  (this->Angles).Yaw.Degrees = hitdir->Degrees + 180.0;
  if ((flags & 1U) == 0) {
    local_3c.Index = 0x86;
    newstate = AActor::FindState(this,&local_3c);
    if (newstate == (FState *)0x0) goto LAB_00528134;
  }
  else {
LAB_00528134:
    if ((flags & 8U) != 0) {
      local_40.Index = 0x87;
      local_44.Index = 0xc9;
      newstate = AActor::FindState(this,&local_40,&local_44,true);
      if (newstate != (FState *)0x0) goto LAB_00528172;
    }
    if (((flags & 2U) == 0) || (newstate = this->MeleeState, newstate == (FState *)0x0))
    goto LAB_0052817f;
  }
LAB_00528172:
  AActor::SetState(this,newstate,false);
LAB_0052817f:
  if ((flags & 4U) == 0) {
    if (((updown != 3) && (cl_pufftype.Value != 0)) && (((this->flags4).Value & 0x8000000) != 0)) {
      local_38 = (DAngle)particledir->Degrees;
      P_DrawSplash2(0x20,&local_70,&local_38,updown,1);
      pbVar1 = (byte *)((long)&(this->renderflags).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if (((flags & 1U) == 0) || (iVar5 = (this->SeeSound).super_FSoundID.ID, iVar5 == 0)) {
      iVar5 = (this->AttackSound).super_FSoundID.ID;
      if (iVar5 == 0) {
        return this;
      }
      sound_id = &local_4c;
    }
    else {
      sound_id = &local_48;
    }
    sound_id->ID = iVar5;
    S_Sound(this,4,sound_id,1.0,1.0);
  }
  return this;
}

Assistant:

AActor *P_SpawnPuff (AActor *source, PClassActor *pufftype, const DVector3 &pos1, DAngle hitdir, DAngle particledir, int updown, int flags, AActor *vict)
{
	AActor *puff;
	DVector3 pos = pos1;

	if (!(flags & PF_NORANDOMZ)) pos.Z += pr_spawnpuff.Random2() / 64.;
	puff = Spawn(pufftype, pos, ALLOW_REPLACE);
	if (puff == NULL) return NULL;

	if ((puff->flags4 & MF4_RANDOMIZE) && puff->tics > 0)
	{
		puff->tics -= pr_spawnpuff() & 3;
		if (puff->tics < 1)
			puff->tics = 1;
	}

	//Moved puff creation and target/master/tracer setting to here. 
	if (puff && vict)
	{
		if (puff->flags7 & MF7_HITTARGET)	puff->target = vict;
		if (puff->flags7 & MF7_HITMASTER)	puff->master = vict;
		if (puff->flags7 & MF7_HITTRACER)	puff->tracer = vict;
	}
	// [BB] If the puff came from a player, set the target of the puff to this player.
	if ( puff && (puff->flags5 & MF5_PUFFGETSOWNER))
		puff->target = source;
	
	// Angle is the opposite of the hit direction (i.e. the puff faces the source.)
	puff->Angles.Yaw = hitdir + 180;

	// If a puff has a crash state and an actor was not hit,
	// it will enter the crash state. This is used by the StrifeSpark
	// and BlasterPuff.
	FState *crashstate;
	if (!(flags & PF_HITTHING) && (crashstate = puff->FindState(NAME_Crash)) != NULL)
	{
		puff->SetState (crashstate);
	}
	else if ((flags & PF_HITTHINGBLEED) && (crashstate = puff->FindState(NAME_Death, NAME_Extreme, true)) != NULL)
	{
		puff->SetState (crashstate);
	}
	else if ((flags & PF_MELEERANGE) && puff->MeleeState != NULL)
	{
		// handle the hard coded state jump of Doom's bullet puff
		// in a more flexible manner.
		puff->SetState (puff->MeleeState);
	}

	if (!(flags & PF_TEMPORARY))
	{
		if (cl_pufftype && updown != 3 && (puff->flags4 & MF4_ALLOWPARTICLES))
		{
			P_DrawSplash2 (32, pos, particledir, updown, 1);
			puff->renderflags |= RF_INVISIBLE;
		}

		if ((flags & PF_HITTHING) && puff->SeeSound)
		{ // Hit thing sound
			S_Sound (puff, CHAN_BODY, puff->SeeSound, 1, ATTN_NORM);
		}
		else if (puff->AttackSound)
		{
			S_Sound (puff, CHAN_BODY, puff->AttackSound, 1, ATTN_NORM);
		}
	}

	return puff;
}